

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiple_shooting_cgmres.cpp
# Opt level: O0

void __thiscall
MultipleShootingCGMRES::initSolution
          (MultipleShootingCGMRES *this,double initial_time,VectorXd *initial_state_vec,
          VectorXd *initial_guess_input_vec,double convergence_radius,int max_iteration)

{
  double in_RDX;
  VectorXd *in_RSI;
  InitCGMRES *this_00;
  double in_RDI;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  int i_1;
  int i;
  InitCGMRES initializer;
  VectorXd initial_lambda_vec;
  VectorXd initial_control_input_and_constraints_error;
  VectorXd initial_control_input_and_constraints_vec;
  DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *other;
  InitCGMRES *this_01;
  int *in_stack_fffffffffffffc48;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *expr;
  Matrix<double,__1,_1,_0,__1,_1> *in_stack_fffffffffffffc50;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *this_02;
  Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *phix;
  DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *this_03;
  double t;
  NMPCModel *in_stack_fffffffffffffc70;
  VectorXd *current_solution_vec;
  InitCGMRES *this_04;
  int in_stack_fffffffffffffcb4;
  NMPCModel in_stack_fffffffffffffcd0;
  Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *in_stack_fffffffffffffd10;
  int in_stack_fffffffffffffd1c;
  double in_stack_fffffffffffffd20;
  VectorXd *in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd34;
  int iVar1;
  double in_stack_fffffffffffffd38;
  InitCGMRES *in_stack_fffffffffffffd40;
  undefined4 local_20c;
  
  current_solution_vec = (VectorXd *)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  this_04 = (InitCGMRES *)CONCAT44(in_XMM1_Db,in_XMM1_Da);
  this_00 = (InitCGMRES *)((long)in_RDI + 0x4c);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>
            (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>
            (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>
            (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
  t = *(double *)((long)in_RDI + 0x38);
  other = *(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> **)((long)in_RDI + 8);
  this_01 = *(InitCGMRES **)((long)in_RDI + 0x10);
  expr = *(PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> **)((long)in_RDI + 0x18);
  this_02 = *(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> **)((long)in_RDI + 0x20);
  phix = *(Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> **)
          ((long)in_RDI + 0x28);
  this_03 = *(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> **)((long)in_RDI + 0x30);
  InitCGMRES::InitCGMRES(this_00,in_stack_fffffffffffffcd0,in_RDI,in_stack_fffffffffffffcb4);
  *(VectorXd **)((long)in_RDI + 0x68) = current_solution_vec;
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *)this_02,expr,
             (type *)this_01);
  InitCGMRES::solve0stepNOCP
            (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
             (VectorXd *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
             in_stack_fffffffffffffd28,in_stack_fffffffffffffd20,in_stack_fffffffffffffd1c,
             in_stack_fffffffffffffd10);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *)this_02,expr,
             (type *)this_01);
  NMPCModel::phixFunc(in_stack_fffffffffffffc70,t,(VectorXd *)this_03,phix);
  for (local_20c = 0; local_20c < *(int *)((long)in_RDI + 0x5c); local_20c = local_20c + 1) {
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
              (this_03,(Index)phix,(int)((ulong)this_02 >> 0x20));
    Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>::operator=
              ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)this_01,other);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col(this_02,(Index)expr);
    Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>::operator=
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)this_01,other);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col(this_02,(Index)expr);
    Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>::operator=
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)this_01,other);
  }
  InitCGMRES::getOptimalityErrorVec(this_04,in_RDX,in_RSI,current_solution_vec);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=
            ((Matrix<double,__1,_1,_0,__1,_1> *)this_01,(Matrix<double,__1,_1,_0,__1,_1> *)other);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x18d4fd);
  for (iVar1 = 0; iVar1 < *(int *)((long)in_RDI + 0x5c); iVar1 = iVar1 + 1) {
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
              (this_03,(Index)phix,(int)((ulong)this_02 >> 0x20));
    Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>::operator=
              ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)this_01,other);
  }
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Zero((Index)expr,(Index)this_01);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
            ((Matrix<double,__1,__1,_0,__1,__1> *)this_01,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)other);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Zero((Index)expr,(Index)this_01);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
            ((Matrix<double,__1,__1,_0,__1,__1> *)this_01,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)other);
  InitCGMRES::~InitCGMRES(this_01);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x18d60d);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x18d61a);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x18d627);
  return;
}

Assistant:

void MultipleShootingCGMRES::initSolution(const double initial_time, const Eigen::VectorXd& initial_state_vec, const Eigen::VectorXd& initial_guess_input_vec, const double convergence_radius, const int max_iteration)
{
    Eigen::VectorXd initial_control_input_and_constraints_vec(dim_control_input_and_constraints_), initial_control_input_and_constraints_error(dim_control_input_and_constraints_), initial_lambda_vec(dim_state_);
    InitCGMRES initializer(model_, difference_increment_, dim_krylov_);
    initial_time_ = initial_time;

    // Intialize the solution
    initializer.solve0stepNOCP(initial_time, initial_state_vec, initial_guess_input_vec, convergence_radius, max_iteration, initial_control_input_and_constraints_vec);
    model_.phixFunc(initial_time, initial_state_vec, initial_lambda_vec);
    for(int i=0; i<horizon_division_num_; i++){
        control_input_and_constraints_seq_.segment(i*dim_control_input_and_constraints_, dim_control_input_and_constraints_) = initial_control_input_and_constraints_vec;
        state_mat_.col(i) = initial_state_vec;
        lambda_mat_.col(i) = initial_lambda_vec;
    }

    // Intialize the optimality error.
    initial_control_input_and_constraints_error = initializer.getOptimalityErrorVec(initial_time, initial_state_vec, initial_control_input_and_constraints_vec);
    for(int i=0; i<horizon_division_num_; i++){
        control_input_and_constraints_error_seq_.segment(i*dim_control_input_and_constraints_, dim_control_input_and_constraints_) = initial_control_input_and_constraints_error;
    }
    state_error_mat_ = Eigen::MatrixXd::Zero(dim_state_, horizon_division_num_);
    lambda_error_mat_ = Eigen::MatrixXd::Zero(dim_state_, horizon_division_num_);
}